

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kgc.cpp
# Opt level: O0

Value * __thiscall Kgc::allocNew(Kgc *this,ValueType type)

{
  ValueType type_local;
  Kgc *this_local;
  
  switch(type) {
  case BOOLEAN:
    this_local = (Kgc *)operator_new(0x20);
    PrimitiveValue<bool,_(ValueType)0>::PrimitiveValue
              ((PrimitiveValue<bool,_(ValueType)0> *)this_local);
    break;
  case STRING:
    this_local = (Kgc *)operator_new(0x20);
    PrimitiveValue<const_char_*,_(ValueType)1>::PrimitiveValue
              ((PrimitiveValue<const_char_*,_(ValueType)1> *)this_local);
    break;
  case NIL:
    this_local = (Kgc *)operator_new(0x18);
    Nil::Nil((Nil *)this_local);
    break;
  case CELL:
    this_local = (Kgc *)operator_new(0x28);
    Cell::Cell((Cell *)this_local);
    break;
  case SYMBOL:
    this_local = (Kgc *)operator_new(0x20);
    PrimitiveValue<const_char_*,_(ValueType)4>::PrimitiveValue
              ((PrimitiveValue<const_char_*,_(ValueType)4> *)this_local);
    break;
  case PRIM_PROC:
    this_local = (Kgc *)operator_new(0x20);
    PrimitiveProc::PrimitiveProc((PrimitiveProc *)this_local);
    break;
  case COMP_PROC:
    this_local = (Kgc *)operator_new(0x30);
    CompoundProc::CompoundProc((CompoundProc *)this_local);
    break;
  case INPUT_PORT:
    this_local = (Kgc *)operator_new(0x20);
    InputPort::InputPort((InputPort *)this_local);
    break;
  case OUTPUT_PORT:
    this_local = (Kgc *)operator_new(0x20);
    OutputPort::OutputPort((OutputPort *)this_local);
    break;
  case EOF_OBJECT:
    this_local = (Kgc *)operator_new(0x18);
    Eof::Eof((Eof *)this_local);
    break;
  default:
    __assert_fail("false",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jfourkiotis[P]kat/kgc.cpp"
                  ,0x94,"Value *Kgc::allocNew(ValueType)");
  }
  return (Value *)this_local;
}

Assistant:

Value* Kgc::allocNew(ValueType type)
{
    switch (type)
    {
        case ValueType::COMP_PROC:
            return new CompoundProc;
        case ValueType::CELL:
            return new Cell;
        case ValueType::INPUT_PORT:
            return new InputPort;
        case ValueType::OUTPUT_PORT:
            return new OutputPort;
        case ValueType::PRIM_PROC:
            return new PrimitiveProc;
        case ValueType::BOOLEAN:
            return new Boolean;
        case ValueType::STRING:
            return new String;
        case ValueType::SYMBOL:
            return new Symbol;
        case ValueType::NIL:
            return new Nil;
        case ValueType::EOF_OBJECT:
            return new Eof;
        default:
            assert(false);
            return nullptr;
    }
}